

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int * Abc_FrameMiniAigReadCoArrivals(Abc_Frame_t *pAbc)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Man_t *pGVar3;
  int *__ptr;
  int *__dest;
  int *pArray;
  char *__s;
  long lVar4;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start()";
  }
  else {
    pGVar3 = Abc_FrameReadGia(pAbc);
    if (pGVar3 == (Gia_Man_t *)0x0) {
      __s = "Current network in ABC framework is not defined.";
    }
    else {
      pVVar2 = pGVar3->vCoArrs;
      if (pVVar2 != (Vec_Int_t *)0x0) {
        __ptr = (int *)malloc(0x10);
        iVar1 = pVVar2->nSize;
        lVar4 = (long)iVar1;
        __ptr[1] = iVar1;
        *__ptr = iVar1;
        if (lVar4 == 0) {
          __dest = (int *)0x0;
        }
        else {
          __dest = (int *)malloc(lVar4 * 4);
        }
        *(int **)(__ptr + 2) = __dest;
        memcpy(__dest,pVVar2->pArray,lVar4 << 2);
        __ptr[0] = 0;
        __ptr[1] = 0;
        __ptr[2] = 0;
        __ptr[3] = 0;
        if (*(void **)(__ptr + 2) != (void *)0x0) {
          free(*(void **)(__ptr + 2));
          __ptr[2] = 0;
          __ptr[3] = 0;
        }
        free(__ptr);
        return __dest;
      }
      __s = "Current network in ABC framework has no CO arrival times.";
    }
  }
  puts(__s);
  return (int *)0x0;
}

Assistant:

int * Abc_FrameMiniAigReadCoArrivals( Abc_Frame_t * pAbc )
{
    Vec_Int_t * vArrs; int * pArrs;
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start()\n" ); return NULL; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return NULL; }
    if ( pGia->vCoArrs == NULL )
        { printf( "Current network in ABC framework has no CO arrival times.\n" ); return NULL; }
    vArrs = Vec_IntDup( pGia->vCoArrs );
    pArrs = Vec_IntReleaseArray( vArrs );
    Vec_IntFree( vArrs );
    return pArrs;
}